

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeDumper.cpp
# Opt level: O0

void Js::ByteCodeDumper::
     DumpElementI<Js::OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>
               (OpCode op,OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ByteCodeReader *reader_local;
  FunctionBody *dumpFunction_local;
  OpLayoutT_ElementI<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data_local;
  OpCode op_local;
  
  if ((op == TypeofElem) || ((ushort)(op - LdElemI_A) < 3)) {
    Output::Print(L" R%d = R%d[R%d]",(ulong)data->Value,(ulong)data->Instance,(ulong)data->Element);
    return;
  }
  if (3 < (ushort)(op - StElemI_A)) {
    if ((ushort)(op - DeleteElemI_A) < 2) {
      Output::Print(L" R%d[R%d]",(ulong)data->Instance,(ulong)data->Element);
      return;
    }
    if (((op != InitClassMemberComputedName) && (1 < (ushort)(op - InitClassMemberSetComputedName)))
       && (2 < (ushort)(op - InitSetElemI))) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeDumper.cpp"
                                  ,0x20b,"(false)","Unknown OpCode for OpLayoutElementI");
      if (bVar2) {
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
        return;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  Output::Print(L" R%d[R%d] = R%d",(ulong)data->Instance,(ulong)data->Element,(ulong)data->Value);
  return;
}

Assistant:

void ByteCodeDumper::DumpElementI(OpCode op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        switch (op)
        {
            case OpCode::ProfiledLdElemI_A:
            case OpCode::LdElemI_A:
            case OpCode::LdMethodElem:
            case OpCode::TypeofElem:
            {
                Output::Print(_u(" R%d = R%d[R%d]"), data->Value, data->Instance, data->Element);
                break;
            }
            case OpCode::ProfiledStElemI_A:
            case OpCode::ProfiledStElemI_A_Strict:
            case OpCode::StElemI_A:
            case OpCode::StElemI_A_Strict:
            case OpCode::InitSetElemI:
            case OpCode::InitGetElemI:
            case OpCode::InitComputedProperty:
            case OpCode::InitClassMemberComputedName:
            case OpCode::InitClassMemberGetComputedName:
            case OpCode::InitClassMemberSetComputedName:
            {
                Output::Print(_u(" R%d[R%d] = R%d"), data->Instance, data->Element, data->Value);
                break;
            }
            case OpCode::DeleteElemI_A:
            case OpCode::DeleteElemIStrict_A:
            {
                Output::Print(_u(" R%d[R%d]"), data->Instance, data->Element);
                break;
            }
            default:
            {
                AssertMsg(false, "Unknown OpCode for OpLayoutElementI");
                break;
            }
        }
    }